

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

void square_sense_pile(chunk_conflict *c,loc grid,_func__Bool_object_ptr *pred)

{
  _Bool _Var1;
  object *obj;
  
  if (cave != c) {
    return;
  }
  obj = square_object(c,grid);
  do {
    if (obj == (object *)0x0) {
      forget_remembered_objects(c,(chunk_conflict *)player->cave,grid,pred);
      return;
    }
    if (pred == (_func__Bool_object_ptr *)0x0) {
LAB_001297fb:
      object_sense(player,obj);
    }
    else {
      _Var1 = (*pred)(obj);
      if (_Var1) goto LAB_001297fb;
    }
    obj = obj->next;
  } while( true );
}

Assistant:

void square_sense_pile(struct chunk *c, struct loc grid,
		bool (*pred)(const struct object*))
{
	struct object *obj;

	if (c != cave) return;

	/* Sense the requested classes of items on this grid */
	for (obj = square_object(c, grid); obj; obj = obj->next) {
		if (!pred || (*pred)(obj)) {
			object_sense(player, obj);
		}
	}

	forget_remembered_objects(c, player->cave, grid, pred);
}